

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestSpec::NamePattern::matches(NamePattern *this,TestCaseInfo *testCase)

{
  bool bVar1;
  string *in_stack_00000070;
  WildcardPattern *in_stack_00000078;
  string *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  toLower(in_stack_ffffffffffffffc8);
  bVar1 = WildcardPattern::matches(in_stack_00000078,in_stack_00000070);
  std::__cxx11::string::~string(local_30);
  return bVar1;
}

Assistant:

virtual bool matches( TestCaseInfo const& testCase ) const {
                return m_wildcardPattern.matches( toLower( testCase.name ) );
            }